

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cpp
# Opt level: O1

char * asmjit::DebugUtils::errorAsString(Error err)

{
  char cVar1;
  char *pcVar2;
  Error EVar3;
  Error EVar4;
  
  EVar3 = 0x38;
  if (err < 0x38) {
    EVar3 = err;
  }
  pcVar2 = "Ok";
  if (err != 0) {
    EVar4 = 0;
    do {
      do {
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
      EVar4 = EVar4 + 1;
    } while (EVar4 != EVar3);
  }
  return pcVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE const char* DebugUtils::errorAsString(Error err) noexcept {
#if !defined(ASMJIT_DISABLE_TEXT)
  return Utils::findPackedString(errorMessages, std::min<Error>(err, kErrorCount));
#else
  static const char noMessage[] = "";
  return noMessage;
#endif
}